

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TCGv_i64 arg2;
  TCGv_i64 tsize;
  int size;
  int r3;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  size = get_field1(s,FLD_O_r1,FLD_C_b1);
  iVar3 = get_field1(s,FLD_O_r3,FLD_C_i3);
  iVar4 = (int)s->insn->data;
  arg2 = tcg_const_i64_s390x(tcg_ctx_00,(long)iVar4);
  while( true ) {
    if (iVar4 == 8) {
      pTVar1 = tcg_ctx_00->regs[size];
      pTVar2 = o->in2;
      iVar5 = get_mem_index(s);
      tcg_gen_qemu_st64(tcg_ctx_00,pTVar1,pTVar2,iVar5);
    }
    else {
      pTVar1 = tcg_ctx_00->regs[size];
      pTVar2 = o->in2;
      iVar5 = get_mem_index(s);
      tcg_gen_qemu_st32(tcg_ctx_00,pTVar1,pTVar2,iVar5);
    }
    if (size == iVar3) break;
    tcg_gen_add_i64(tcg_ctx_00,o->in2,o->in2,arg2);
    size = size + 1U & 0xf;
  }
  tcg_temp_free_i64(tcg_ctx_00,arg2);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_stm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    int size = s->insn->data;
    TCGv_i64 tsize = tcg_const_i64(tcg_ctx, size);

    while (1) {
        if (size == 8) {
            tcg_gen_qemu_st64(tcg_ctx, tcg_ctx->regs[r1], o->in2, get_mem_index(s));
        } else {
            tcg_gen_qemu_st32(tcg_ctx, tcg_ctx->regs[r1], o->in2, get_mem_index(s));
        }
        if (r1 == r3) {
            break;
        }
        tcg_gen_add_i64(tcg_ctx, o->in2, o->in2, tsize);
        r1 = (r1 + 1) & 15;
    }

    tcg_temp_free_i64(tcg_ctx, tsize);
    return DISAS_NEXT;
}